

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

void __thiscall TRM::Model::load_texture(Model *this,string *filename,char *suffix,TGAImage *img)

{
  long *plVar1;
  pointer pcVar2;
  bool bVar3;
  long lVar4;
  undefined8 *puVar5;
  ostream *poVar6;
  char *pcVar7;
  ulong uVar8;
  string texfile;
  allocator local_a1;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  long *local_80;
  long local_78;
  long local_70 [2];
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  ulong *local_40;
  long local_38;
  ulong local_30 [2];
  
  pcVar2 = (filename->_M_dataplus)._M_p;
  local_80 = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + filename->_M_string_length);
  lVar4 = std::__cxx11::string::find_last_of((char *)&local_80,0x1072fd,0xffffffffffffffff);
  if (lVar4 == -1) goto LAB_0010566e;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)&local_80);
  std::__cxx11::string::string((string *)&local_60,suffix,&local_a1);
  uVar8 = 0xf;
  if (local_40 != local_30) {
    uVar8 = local_30[0];
  }
  if (uVar8 < (ulong)(local_58 + local_38)) {
    uVar8 = 0xf;
    if (local_60 != local_50) {
      uVar8 = local_50[0];
    }
    if (uVar8 < (ulong)(local_58 + local_38)) goto LAB_00105505;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_40);
  }
  else {
LAB_00105505:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_60);
  }
  local_a0 = &local_90;
  plVar1 = puVar5 + 2;
  if ((long *)*puVar5 == plVar1) {
    local_90 = *plVar1;
    uStack_88 = puVar5[3];
  }
  else {
    local_90 = *plVar1;
    local_a0 = (long *)*puVar5;
  }
  local_98 = puVar5[1];
  *puVar5 = plVar1;
  puVar5[1] = 0;
  *(undefined1 *)plVar1 = 0;
  std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"texture file ",0xd);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_80,local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," loading ",9);
  bVar3 = TGAImage::read_tga_file(img,(char *)local_80);
  pcVar7 = "failed";
  if (bVar3) {
    pcVar7 = "ok";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,(ulong)!bVar3 * 4 + 2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  TGAImage::flip_vertically(img);
LAB_0010566e:
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return;
}

Assistant:

void Model::load_texture(std::string filename, const char *suffix,
                         TGAImage &img) {
  std::string texfile(filename);
  size_t dot = texfile.find_last_of(".");
  if (dot != std::string::npos) {
    texfile = texfile.substr(0, dot) + std::string(suffix);
    std::cerr << "texture file " << texfile << " loading "
              << (img.read_tga_file(texfile.c_str()) ? "ok" : "failed")
              << std::endl;
    img.flip_vertically();
  }
}